

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::Builder(Builder *this,Builder *that)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_00000038;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_00000040;
  __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *this_00;
  arena_type *this_01;
  Buffer<unsigned_char> *in_stack_ffffffffffffffc8;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_ffffffffffffffd0;
  short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL> in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::shared_ptr
            ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)0x104fb4);
  ((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
  &in_RDI[1]._M_ptr)->_M_ptr = (element_type *)0x0;
  in_RDI[1]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
  &in_RDI[2]._M_ptr)->_M_ptr =
       (element_type *)
       in_RSI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this_01 = (arena_type *)&in_RDI[2]._M_refcount;
  arena<64UL,_8UL>::arena(this_01);
  short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>::short_alloc
            ((short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL> *)
             &stack0xffffffffffffffe8,this_01);
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::vector((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
            *)this_01,(allocator_type *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_RSI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffffe8.a_);
  *(byte *)&this_00[10]._M_refcount._M_pi =
       *(byte *)&in_RSI[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start & 1;
  ((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
  &this_00[0xb]._M_ptr)->_M_ptr =
       (element_type *)
       in_RSI[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::operator=(in_stack_00000040,in_stack_00000038);
  bVar1 = std::operator==((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)this_01,
                          this_00);
  if (bVar1) {
    ((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
    &this_00[1]._M_ptr)->_M_ptr =
         (element_type *)
         (in_RSI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    std::
    __shared_ptr_access<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)this_01);
    std::
    make_shared<arangodb::velocypack::Buffer<unsigned_char>,arangodb::velocypack::Buffer<unsigned_char>&>
              (in_stack_ffffffffffffffc8);
    std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::operator=
              ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)this_01,
               (shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)this_00);
    std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::~shared_ptr
              ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)0x1050ff);
    peVar2 = std::
             __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
             get(this_00);
    ((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
    &this_00[1]._M_ptr)->_M_ptr = peVar2;
  }
  if (((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
      &this_00[1]._M_ptr)->_M_ptr != (element_type *)0x0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             Buffer<unsigned_char>::data
                       (((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                          *)&this_00[1]._M_ptr)->_M_ptr);
    this_00[1]._M_refcount._M_pi = p_Var3;
  }
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::reserve(in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

Builder::Builder(Builder const& that)
    : _bufferPtr(nullptr),
      _start(nullptr),
      _pos(that._pos),
      _arena(),
      _stack(_arena),
      _indexes(that._indexes),
      _keyWritten(that._keyWritten),
      options(that.options) {
  VELOCYPACK_ASSERT(options != nullptr);

  _stack = that._stack;

  if (that._buffer == nullptr) {
    _bufferPtr = that._bufferPtr;
  } else {
    _buffer = std::make_shared<Buffer<uint8_t>>(*that._buffer);
    _bufferPtr = _buffer.get();
  }

  if (_bufferPtr != nullptr) {
    _start = _bufferPtr->data();
  }

  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
}